

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daxpy.c
# Opt level: O2

void daxpy_(integer *n,doublereal *da,doublereal *dx,integer *incx,doublereal *dy,integer *incy)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  double *pdVar5;
  ulong uVar6;
  double *pdVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  uVar1 = *n;
  uVar4 = (ulong)uVar1;
  if ((0 < (int)uVar1) && ((*da != 0.0 || (NAN(*da))))) {
    iVar2 = *incx;
    if ((long)iVar2 == 1) {
      iVar8 = *incy;
      if (iVar8 == 1) {
        if ((uVar1 & 3) != 0) {
          for (uVar6 = 0; (uVar1 & 3) != uVar6; uVar6 = uVar6 + 1) {
            dy[uVar6] = *da * dx[uVar6] + dy[uVar6];
          }
          if ((int)uVar1 < 4) {
            return;
          }
        }
        for (uVar6 = (ulong)(uVar1 & 3) + 1; uVar6 <= uVar4; uVar6 = uVar6 + 4) {
          dy[uVar6 - 1] = *da * dx[uVar6 - 1] + dy[uVar6 - 1];
          dy[uVar6] = *da * dx[uVar6] + dy[uVar6];
          dy[uVar6 + 1] = *da * dx[uVar6 + 1] + dy[uVar6 + 1];
          dy[uVar6 + 2] = *da * dx[uVar6 + 2] + dy[uVar6 + 2];
        }
        return;
      }
      iVar9 = 1 - uVar1;
      lVar10 = 1;
    }
    else {
      iVar9 = 1 - uVar1;
      iVar3 = iVar2 * iVar9 + 1;
      if (-1 < iVar2) {
        iVar3 = 1;
      }
      iVar8 = *incy;
      lVar10 = (long)iVar3;
    }
    iVar3 = 1;
    if (iVar8 < 0) {
      iVar3 = iVar9 * iVar8 + 1;
    }
    pdVar7 = dy + (long)iVar3 + -1;
    pdVar5 = dx + lVar10 + -1;
    while (iVar3 = (int)uVar4, uVar4 = (ulong)(iVar3 - 1), iVar3 != 0) {
      *pdVar7 = *da * *pdVar5 + *pdVar7;
      pdVar7 = pdVar7 + iVar8;
      pdVar5 = pdVar5 + iVar2;
    }
  }
  return;
}

Assistant:

void daxpy_(integer *n, doublereal *da, doublereal *dx, 
	integer *incx, doublereal *dy, integer *incy)
{


    /* System generated locals */

    /* Local variables */
    integer i, m, ix, iy, mp1;


/*     constant times a vector plus a vector.   
       uses unrolled loops for increments equal to one.   
       jack dongarra, linpack, 3/11/78.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define DY(I) dy[(I)-1]
#define DX(I) dx[(I)-1]


    if (*n <= 0) {
	return;
    }
    if (*da == 0.) {
	return;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*        code for unequal increments or equal increments   
            not equal to 1 */

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    for (i = 1; i <= *n; ++i) {
	DY(iy) += *da * DX(ix);
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    return;

/*        code for both increments equal to 1   


          clean-up loop */

L20:
    m = *n % 4;
    if (m == 0) {
	goto L40;
    }
    for (i = 1; i <= m; ++i) {
	DY(i) += *da * DX(i);
/* L30: */
    }
    if (*n < 4) {
	return;
    }
L40:
    mp1 = m + 1;
    for (i = mp1; i <= *n; i += 4) {
	DY(i) += *da * DX(i);
	DY(i + 1) += *da * DX(i + 1);
	DY(i + 2) += *da * DX(i + 2);
	DY(i + 3) += *da * DX(i + 3);
/* L50: */
    }
    return;
}